

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.h
# Opt level: O0

void __thiscall ON_UserDataHolder::ON_UserDataHolder(ON_UserDataHolder *this)

{
  ON_UserDataHolder *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b7b1f0;
  return;
}

Assistant:

class ON_CLASS ON_UserDataHolder : public ON_Object
{
public:

  /*
  Description:
    Transfers the user data from source_object to "this".
    When MoveUserDataFrom() returns source_object will not 
    have any user data.  If "this" had user data when 
    MoveUserDataFrom() was called, then that user data is
    destroyed.
  Parameters:
    source_object - [in] The "const" is a lie.  It is
      there because, in practice the source object is frequently
      const and const_cast ends up being excessively used.
  Returns:
    Number of user data items that were moved from source_object to "this" ON_UserDataHolder.
  */
  unsigned int MoveUserDataFrom(
    const ON_Object& source_object
    );


  /*
  Description:
    Copies the data from source_object with copy_count > 0 to "this" ON_UserDataHolder.
  Parameters:
    source_object - [in]
      This object and it's user data are not modified.
    user_data_item_id - [in]
      If not nil, then only userdata with this item id will be coped
  Returns:
    Number of user data items that were copied from source_object to "this" ON_UserDataHolder.
  */
   unsigned int CopyUserDataFrom(
    const ON_Object& source_object,
    ON_UUID user_data_item_id
    );

  /*
  Description:
    Moves the user data on "this" ON_UserDataHolder to destination_object.
    When MoveUserDataTo() returns "this" ON_UserDataHolder will not have any user data.
  Parameters:
    destination_object - [in] The "const" is a lie.  It is
      there because, in practice the source object is generally
      const and const_cast ends up being constantly used.
    bAppend - [in]
      true:
        Existing user data on destination_object is left unchanged.
        MoveUserDataTo( destination_object, true ) is identical to calling
        MoveUserDataTo( destination_object, ON_Object::UserDataConflictResolution::destination_object).
      false:
        Existing user data on destination_object is destroyed.
  Returns:
    Number of user data items moved from "this" ON_UserDataHolder to destination_object.
  */
  unsigned int MoveUserDataTo(
    const ON_Object& destination_object,
    bool bAppend 
    );

  /*
  Description:
    Moves the user data on "this" ON_UserDataHolder to destination_object.
    When MoveUserDataTo() returns "this" ON_UserDataHolder will not have any user data.
  Parameters:
    destination_object - [in]
      The "const" is a lie.  It is there because, in practice the source object is generally
      const and const_cast ends up being constantly used.
    user_data_item_id - [in]
      If not nil, then only user data items with this id will be considered for moving.
    userdata_conflict_resolution - [in]
      If destination_object and "this" ON_UserDataHolder have the same
      type of user data item, then userdata_conflict_resolution
      is used to determine if that destination_object user data item
      is replaced with the one on "this" ON_UserDataHolder.
  Returns:
    Number of user data items moved from "this" ON_UserDataHolder to destination_object.
  */
  unsigned int MoveUserDataTo(
    const ON_Object& destination_object,
    ON_UUID user_data_item_id,
    ON_Object::UserDataConflictResolution userdata_conflict_resolution
    );


  bool IsValid( class ON_TextLog* text_log = nullptr ) const override;
}